

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog_util.c
# Opt level: O0

int map_file_contents(file_stream *strm,u64 size)

{
  void *pvVar1;
  int *piVar2;
  size_t in_RSI;
  int *in_RDI;
  file_stream *in_stack_00000018;
  int local_4;
  
  if (in_RSI == 0) {
    local_4 = read_full_contents(in_stack_00000018);
  }
  else {
    pvVar1 = mmap64((void *)0x0,in_RSI,1,1,*in_RDI,0);
    *(void **)(in_RDI + 8) = pvVar1;
    if (*(long *)(in_RDI + 8) == -1) {
      in_RDI[8] = 0;
      in_RDI[9] = 0;
      piVar2 = __errno_location();
      if ((*piVar2 == 0x13) || (piVar2 = __errno_location(), *piVar2 == 0x16)) {
        local_4 = read_full_contents(in_stack_00000018);
      }
      else {
        piVar2 = __errno_location();
        if (*piVar2 == 0xc) {
          msg("%s is too large to be processed by this program",*(undefined8 *)(in_RDI + 2));
        }
        else {
          msg_errno("Unable to map %s into memory",*(undefined8 *)(in_RDI + 2));
        }
        local_4 = -1;
      }
    }
    else {
      posix_madvise(*(void **)(in_RDI + 8),in_RSI,2);
      *(int **)(in_RDI + 6) = in_RDI;
      *(size_t *)(in_RDI + 10) = in_RSI;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int
map_file_contents(struct file_stream *strm, u64 size)
{
	if (size == 0) /* mmap isn't supported on empty files */
		return read_full_contents(strm);

	if (size > SIZE_MAX) {
		msg("%"TS" is too large to be processed by this program",
		    strm->name);
		return -1;
	}
#ifdef _WIN32
	strm->mmap_token = CreateFileMapping(
				(HANDLE)(intptr_t)_get_osfhandle(strm->fd),
				NULL, PAGE_READONLY, 0, 0, NULL);
	if (strm->mmap_token == NULL) {
		DWORD err = GetLastError();
		if (err == ERROR_BAD_EXE_FORMAT) /* mmap unsupported */
			return read_full_contents(strm);
		msg("Unable create file mapping for %"TS": Windows error %u",
		    strm->name, (unsigned int)err);
		return -1;
	}

	strm->mmap_mem = MapViewOfFile((HANDLE)strm->mmap_token,
				       FILE_MAP_READ, 0, 0, size);
	if (strm->mmap_mem == NULL) {
		msg("Unable to map %"TS" into memory: Windows error %u",
		    strm->name, (unsigned int)GetLastError());
		CloseHandle((HANDLE)strm->mmap_token);
		return -1;
	}
#else /* _WIN32 */
	strm->mmap_mem = mmap(NULL, size, PROT_READ, MAP_SHARED, strm->fd, 0);
	if (strm->mmap_mem == MAP_FAILED) {
		strm->mmap_mem = NULL;
		if (errno == ENODEV /* standard */ ||
		    errno == EINVAL /* macOS */) {
			/* mmap isn't supported on this file */
			return read_full_contents(strm);
		}
		if (errno == ENOMEM) {
			msg("%"TS" is too large to be processed by this "
			    "program", strm->name);
		} else {
			msg_errno("Unable to map %"TS" into memory",
				  strm->name);
		}
		return -1;
	}

#if defined(HAVE_POSIX_MADVISE) || \
	/* fallback detection method for direct compilation */ \
	(!defined(HAVE_CONFIG_H) && defined(POSIX_MADV_SEQUENTIAL))
	(void)posix_madvise(strm->mmap_mem, size, POSIX_MADV_SEQUENTIAL);
#endif
	strm->mmap_token = strm; /* anything that's not NULL */

#endif /* !_WIN32 */
	strm->mmap_size = size;
	return 0;
}